

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qxmlstream.cpp
# Opt level: O0

void __thiscall
QXmlStreamWriter::writeAttribute
          (QXmlStreamWriter *this,QAnyStringView namespaceUri,QAnyStringView name,
          QAnyStringView value)

{
  long lVar1;
  QAnyStringView s;
  QAnyStringView namespaceUri_00;
  bool bVar2;
  QXmlStreamWriterPrivate *this_00;
  NamespaceDeclaration *this_01;
  const_pointer pvVar3;
  QAnyStringView *this_02;
  undefined8 in_RCX;
  int *piVar4;
  size_t __n;
  size_t in_RSI;
  anon_union_8_3_8ad491a7_for_QAnyStringView_6 in_R8;
  long in_FS_OFFSET;
  NamespaceDeclaration *namespaceDeclaration;
  QXmlStreamWriterPrivate *d;
  qsizetype in_stack_fffffffffffffe50;
  QXmlStreamWriterPrivate *pQVar5;
  QChar *in_stack_fffffffffffffe58;
  QAnyStringView *in_stack_fffffffffffffe60;
  QXmlStreamWriterPrivate *this_03;
  undefined8 in_stack_fffffffffffffeb8;
  int *piVar6;
  undefined1 escapeWhitespace;
  undefined6 in_stack_fffffffffffffec0;
  undefined1 in_stack_fffffffffffffec6;
  undefined1 in_stack_fffffffffffffec7;
  int local_a8 [2];
  void *local_a0;
  NamespaceDeclaration *local_98;
  qsizetype qStack_90;
  int local_88;
  void *local_80;
  undefined8 local_78;
  int local_68;
  void *local_60;
  int local_58 [2];
  void *local_50;
  int local_48;
  void *local_40;
  undefined8 local_28;
  
  escapeWhitespace = (undefined1)((ulong)in_stack_fffffffffffffeb8 >> 0x38);
  pQVar5 = (QXmlStreamWriterPrivate *)&stack0x00000008;
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  local_28 = in_RCX;
  this_00 = d_func((QXmlStreamWriter *)0x64e5e1);
  piVar4 = (int *)0x1;
  namespaceUri_00.m_size = in_RSI;
  namespaceUri_00.field_0.m_data = in_R8.m_data;
  this_01 = QXmlStreamWriterPrivate::findNamespace
                      (pQVar5,namespaceUri_00,(bool)in_stack_fffffffffffffec7,
                       (bool)in_stack_fffffffffffffec6);
  std::data<char_const,2ul>((char (*) [2])0x91a05b);
  QtPrivate::lengthHelperContainer<char,2ul>((char (*) [2])0x64e69a);
  QAnyStringView::QAnyStringView<char,_true>
            (in_stack_fffffffffffffe60,(char *)in_stack_fffffffffffffe58,in_stack_fffffffffffffe50);
  QXmlStreamWriterPrivate::write(this_00,local_48,local_40,(size_t)piVar4);
  bVar2 = QtPrivate::XmlStringRef::isEmpty(&this_01->prefix);
  if (!bVar2) {
    piVar4 = local_58;
    piVar6 = piVar4;
    pvVar3 = std::data<QtPrivate::XmlStringRef>((XmlStringRef *)0x64e746);
    escapeWhitespace = (undefined1)((ulong)piVar6 >> 0x38);
    in_stack_fffffffffffffec0 = SUB86(pvVar3,0);
    in_stack_fffffffffffffec6 = (undefined1)((ulong)pvVar3 >> 0x30);
    in_stack_fffffffffffffec7 = (undefined1)((ulong)pvVar3 >> 0x38);
    QtPrivate::lengthHelperContainer<QtPrivate::XmlStringRef>((XmlStringRef *)0x64e758);
    QAnyStringView::QAnyStringView<QChar,_true>
              (in_stack_fffffffffffffe60,in_stack_fffffffffffffe58,in_stack_fffffffffffffe50);
    QXmlStreamWriterPrivate::write(this_00,local_58[0],local_50,(size_t)piVar4);
    std::data<char_const,2ul>((char (*) [2])0x93f6e5);
    QtPrivate::lengthHelperContainer<char,2ul>((char (*) [2])0x64e7ea);
    QAnyStringView::QAnyStringView<char,_true>
              (in_stack_fffffffffffffe60,(char *)in_stack_fffffffffffffe58,in_stack_fffffffffffffe50
              );
    QXmlStreamWriterPrivate::write(this_00,local_68,local_60,(size_t)piVar4);
  }
  local_78 = local_28;
  QXmlStreamWriterPrivate::write(this_00,(int)local_28,in_R8.m_data,(size_t)piVar4);
  this_03 = this_00;
  std::data<char_const,3ul>((char (*) [3])0x93071d);
  QtPrivate::lengthHelperContainer<char,3ul>((char (*) [3])0x64e8b0);
  QAnyStringView::QAnyStringView<char,_true>
            (in_stack_fffffffffffffe60,(char *)in_stack_fffffffffffffe58,in_stack_fffffffffffffe50);
  QXmlStreamWriterPrivate::write(this_03,local_88,local_80,(size_t)piVar4);
  local_98 = (pQVar5->super_QXmlStreamPrivateTagStack).namespaceDeclarations.data;
  qStack_90 = (pQVar5->super_QXmlStreamPrivateTagStack).namespaceDeclarations.tos;
  __n = 1;
  s.field_0._6_1_ = in_stack_fffffffffffffec6;
  s.field_0._0_6_ = in_stack_fffffffffffffec0;
  s.field_0._7_1_ = in_stack_fffffffffffffec7;
  s.m_size = (size_t)pQVar5;
  QXmlStreamWriterPrivate::writeEscaped(this_03,s,(bool)escapeWhitespace);
  piVar4 = local_a8;
  pQVar5 = this_00;
  this_02 = (QAnyStringView *)std::data<char_const,2ul>((char (*) [2])0x92e5dd);
  QtPrivate::lengthHelperContainer<char,2ul>((char (*) [2])0x64e97e);
  QAnyStringView::QAnyStringView<char,_true>(this_02,(char *)piVar4,(qsizetype)pQVar5);
  QXmlStreamWriterPrivate::write(pQVar5,local_a8[0],local_a0,__n);
  *(ushort *)&this_00->field_0x78 = *(ushort *)&this_00->field_0x78 | 0x200;
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QXmlStreamWriter::writeAttribute(QAnyStringView namespaceUri, QAnyStringView name, QAnyStringView value)
{
    Q_D(QXmlStreamWriter);
    Q_ASSERT(d->inStartElement);
    Q_ASSERT(!contains(name, ':'));
    QXmlStreamWriterPrivate::NamespaceDeclaration &namespaceDeclaration = d->findNamespace(namespaceUri, true, true);
    d->write(" ");
    if (!namespaceDeclaration.prefix.isEmpty()) {
        d->write(namespaceDeclaration.prefix);
        d->write(":");
    }
    d->write(name);
    d->write("=\"");
    d->writeEscaped(value, true);
    d->write("\"");
    d->didWriteAnyToken = true;
}